

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

void __thiscall
chrono::ChArchiveIn::in<chrono::ChVector<double>*>
          (ChArchiveIn *this,
          ChNameValue<std::vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>_>
          *bVal)

{
  undefined8 uVar1;
  vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_> *pvVar2;
  char *pcVar3;
  reference ppCVar4;
  ChNameValue<chrono::ChVector<double>_*> local_80;
  undefined1 local_68 [8];
  ChNameValue<chrono::ChVector<double>_*> array_val;
  ChVector<double> *element;
  char idname [20];
  size_type local_28;
  size_t i;
  size_t arraysize;
  ChNameValue<std::vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>_>
  *bVal_local;
  ChArchiveIn *this_local;
  
  arraysize = (size_t)bVal;
  bVal_local = (ChNameValue<std::vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>_>
                *)this;
  pvVar2 = ChNameValue<std::vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>_>
           ::value(bVal);
  std::vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>::clear
            (pvVar2);
  pcVar3 = ChNameValue<std::vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>_>
           ::name(bVal);
  (*(this->super_ChArchive)._vptr_ChArchive[0xe])(this,pcVar3,&i);
  pvVar2 = ChNameValue<std::vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>_>
           ::value(bVal);
  std::vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>::resize
            (pvVar2,i);
  for (local_28 = 0; local_28 < i; local_28 = local_28 + 1) {
    sprintf((char *)&element,"%lu",local_28);
    ChNameValue<chrono::ChVector<double>_*>::ChNameValue
              ((ChNameValue<chrono::ChVector<double>_*> *)local_68,(char *)&element,
               (ChVector<double> **)&array_val._flags,'\0');
    ChNameValue<chrono::ChVector<double>_*>::ChNameValue
              (&local_80,(ChNameValue<chrono::ChVector<double>_*> *)local_68);
    in<chrono::ChVector<double>>(this,&local_80);
    ChNameValue<chrono::ChVector<double>_*>::~ChNameValue(&local_80);
    uVar1 = array_val._16_8_;
    pvVar2 = ChNameValue<std::vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>_>
             ::value(bVal);
    ppCVar4 = std::vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>::
              operator[](pvVar2,local_28);
    *ppCVar4 = (value_type)uVar1;
    pcVar3 = ChNameValue<std::vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>_>
             ::name(bVal);
    (*(this->super_ChArchive)._vptr_ChArchive[0xf])(this,pcVar3);
    ChNameValue<chrono::ChVector<double>_*>::~ChNameValue
              ((ChNameValue<chrono::ChVector<double>_*> *)local_68);
  }
  pcVar3 = ChNameValue<std::vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>_>
           ::name(bVal);
  (*(this->super_ChArchive)._vptr_ChArchive[0x10])(this,pcVar3);
  return;
}

Assistant:

void in     (ChNameValue< std::vector<T> > bVal) {
          bVal.value().clear();
          size_t arraysize;
          this->in_array_pre(bVal.name(), arraysize);
          bVal.value().resize(arraysize);
          for (size_t i = 0; i<arraysize; ++i)
          {
              char idname[20];
              sprintf(idname, "%lu", (unsigned long)i);
              T element;
              ChNameValue< T > array_val(idname, element);
              this->in (array_val);
              bVal.value()[i]=element;
              this->in_array_between(bVal.name());
          }
          this->in_array_end(bVal.name());
      }